

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_iMultiFab.cpp
# Opt level: O3

Long __thiscall amrex::iMultiFab::sum(iMultiFab *this,int comp,int nghost,bool local)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Long LVar6;
  MFIter mfi;
  Box local_ec;
  Array4<const_int> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)this,true);
  if (local_90.currentIndex < local_90.endIndex) {
    LVar6 = 0;
    do {
      MFIter::growntilebox(&local_ec,&local_90,nghost);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                (&local_d0,&this->super_FabArray<amrex::IArrayBox>,&local_90);
      lVar1 = (long)local_ec.smallend.vect[2];
      if (local_ec.smallend.vect[2] <= local_ec.bigend.vect[2]) {
        lVar2 = local_d0.nstride * (long)comp * 4 +
                ((long)local_ec.smallend.vect[1] - (long)local_d0.begin.y) * local_d0.jstride * 4 +
                (lVar1 - local_d0.begin.z) * local_d0.kstride * 4 +
                (long)local_ec.smallend.vect[0] * 4 + (long)local_d0.begin.x * -4 + (long)local_d0.p
        ;
        do {
          lVar3 = lVar2;
          lVar4 = (long)local_ec.smallend.vect[1];
          if (local_ec.smallend.vect[1] <= local_ec.bigend.vect[1]) {
            do {
              if (local_ec.smallend.vect[0] <= local_ec.bigend.vect[0]) {
                lVar5 = 0;
                do {
                  LVar6 = LVar6 + *(int *)(lVar3 + lVar5 * 4);
                  lVar5 = lVar5 + 1;
                } while ((local_ec.bigend.vect[0] - local_ec.smallend.vect[0]) + 1 != (int)lVar5);
              }
              lVar4 = lVar4 + 1;
              lVar3 = lVar3 + local_d0.jstride * 4;
            } while (local_ec.bigend.vect[1] + 1 != (int)lVar4);
          }
          lVar1 = lVar1 + 1;
          lVar2 = lVar2 + local_d0.kstride * 4;
        } while (local_ec.bigend.vect[2] + 1 != (int)lVar1);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  else {
    LVar6 = 0;
  }
  MFIter::~MFIter(&local_90);
  return LVar6;
}

Assistant:

Long
iMultiFab::sum (int comp, int nghost, bool local) const
{
    BL_PROFILE("iMultiFab::sum()");

    AMREX_ASSERT(nghost >= 0 && nghost <= n_grow.min());

    Long sm = 0;

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion())
    {
        auto const& ma = this->const_arrays();
        sm = ParReduce(TypeList<ReduceOpSum>{}, TypeList<Long>{}, *this, IntVect(nghost),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Long>
        {
            return { static_cast<Long>(ma[box_no](i,j,k,comp)) };
        });
    }
    else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:sm)
#endif
        for (MFIter mfi(*this,true); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            Array4<int const> const& fab = this->const_array(mfi);
            AMREX_LOOP_3D(bx, i, j, k,
            {
                sm += fab(i,j,k,comp);
            });
        }
    }

    if (!local) {
        ParallelAllReduce::Sum(sm, ParallelContext::CommunicatorSub());
    }

    return sm;
}